

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void asio::detail::thread_info_base::deallocate<asio::detail::thread_info_base::default_tag>
               (long param_1,undefined1 *param_2,ulong param_3)

{
  uchar *mem;
  int mem_index;
  int local_24;
  
  if ((param_3 < 0x3fd) && (param_1 != 0)) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      if (*(long *)(param_1 + (long)local_24 * 8) == 0) {
        *param_2 = param_2[param_3];
        *(undefined1 **)(param_1 + (long)local_24 * 8) = param_2;
        return;
      }
    }
  }
  aligned_delete((void *)0x143cd6);
  return;
}

Assistant:

static void deallocate(Purpose, thread_info_base* this_thread,
      void* pointer, std::size_t size)
  {
    if (size <= chunk_size * UCHAR_MAX)
    {
      if (this_thread)
      {
        for (int mem_index = Purpose::begin_mem_index;
            mem_index < Purpose::end_mem_index; ++mem_index)
        {
          if (this_thread->reusable_memory_[mem_index] == 0)
          {
            unsigned char* const mem = static_cast<unsigned char*>(pointer);
            mem[0] = mem[size];
            this_thread->reusable_memory_[mem_index] = pointer;
            return;
          }
        }
      }
    }

    aligned_delete(pointer);
  }